

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoscbundle.cpp
# Opt level: O0

void __thiscall QOscBundle::QOscBundle(QOscBundle *this,QByteArray *data)

{
  char *pcVar1;
  QByteArrayView bv;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  qsizetype qVar6;
  QOscBundle *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  quint32 size;
  bool isImmediate;
  quint32 oscTimePico;
  quint32 oscTimeEpoch;
  QOscBundle subBundle;
  QOscMessage subMessage;
  QByteArray bundleIdentifier;
  QByteArray subdata;
  QByteArray identifier;
  quint32 parsedBytes;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  uint uVar7;
  undefined4 in_stack_fffffffffffffe00;
  uint uVar8;
  int in_stack_fffffffffffffe04;
  int line;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe24;
  int iVar10;
  char local_1c8 [32];
  QOscBundle local_1a8;
  char local_158 [32];
  QOscMessage local_138;
  QByteArray local_100;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  char local_d0 [32];
  char *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  uint local_8c;
  undefined1 local_88 [56];
  QDebug local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(char *)&(in_RDI->d).d = '\0';
  *(char *)((long)&(in_RDI->d).d + 1) = '\0';
  pcVar1 = (char *)((long)&(in_RDI->d).d + 4);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  *(undefined4 *)&(in_RDI->d).ptr = 0;
  QList<QOscBundle>::QList((QList<QOscBundle> *)0x105bae);
  QList<QOscMessage>::QList((QList<QOscMessage> *)0x105bbc);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcTuioBundle();
  anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x105c12);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (char *)in_RDI,in_stack_fffffffffffffe04,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (char *)0x105c2b);
    QMessageLogger::debug();
    QByteArray::toHex((char)local_88);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x105c76);
    QDebug::~QDebug(&local_50);
    local_10 = 0;
  }
  local_8c = 0;
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x105cd5);
  bVar2 = qt_readOscString((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_RDI,
                           (quint32 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
  ;
  line = CONCAT13(1,(int3)in_stack_fffffffffffffe04);
  if (bVar2) {
    local_b0 = "#bundle";
    bVar2 = operator!=((QByteArray *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       (char **)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    line = CONCAT13(bVar2,(int3)line);
  }
  if ((((char)((uint)line >> 0x18) == '\0') &&
      (uVar8 = local_8c, qVar6 = QByteArray::size((QByteArray *)in_RSI), uVar8 <= (uint)qVar6)) &&
     (qVar6 = QByteArray::size((QByteArray *)in_RSI), 7 < (long)(qVar6 - (ulong)local_8c))) {
    QByteArray::constData((QByteArray *)0x105d8e);
    uVar3 = qFromBigEndian<unsigned_int>((void *)CONCAT44(line,uVar8));
    local_8c = local_8c + 4;
    QByteArray::constData((QByteArray *)0x105dc0);
    uVar4 = qFromBigEndian<unsigned_int>((void *)CONCAT44(line,uVar8));
    local_8c = local_8c + 4;
    uVar9 = 0;
    if ((uVar3 == 0) && (uVar4 == 1)) {
      uVar9 = 0x1000000;
    }
    while ((uVar7 = local_8c, qVar6 = QByteArray::size((QByteArray *)in_RSI), uVar7 < (uint)qVar6 &&
           (qVar6 = QByteArray::size((QByteArray *)in_RSI), 3 < (long)(qVar6 - (ulong)local_8c)))) {
      QByteArray::constData((QByteArray *)0x105e57);
      uVar5 = qFromBigEndian<unsigned_int>((void *)CONCAT44(line,uVar8));
      local_8c = local_8c + 4;
      qVar6 = QByteArray::size((QByteArray *)in_RSI);
      if ((long)(qVar6 - (ulong)local_8c) < (long)(ulong)uVar5) break;
      if (uVar5 == 0) {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        local_20 = 0xaaaaaaaaaaaaaaaa;
        lcTuioBundle();
        anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(line,uVar8),
                   (QLoggingCategory *)CONCAT44(uVar7,in_stack_fffffffffffffdf8));
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
          anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x105f07);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(uVar5,in_stack_fffffffffffffe10),(char *)in_RDI,line
                     ,(char *)CONCAT44(uVar7,in_stack_fffffffffffffdf8),(char *)0x105f20);
          QMessageLogger::warning(local_d0,"Empty bundle?");
          local_20 = local_20 & 0xffffffffffffff00;
        }
        *(undefined1 *)&(in_RDI->d).d = 1;
        *(byte *)((long)&(in_RDI->d).d + 1) = (byte)((uint)uVar9 >> 0x18) & 1;
        *(uint *)((long)&(in_RDI->d).d + 4) = uVar3;
        *(uint *)&(in_RDI->d).ptr = uVar4;
        break;
      }
      local_e8 = 0xaaaaaaaaaaaaaaaa;
      local_e0 = 0xaaaaaaaaaaaaaaaa;
      local_d8 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::mid((longlong)&local_e8,(longlong)in_RSI);
      local_8c = uVar5 + local_8c;
      local_100.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_100.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_100.d.size = -0x5555555555555556;
      QByteArray::QByteArray(&local_100,"#bundle",8);
      bVar2 = QByteArray::startsWith((QByteArray *)CONCAT44(line,uVar8),(char)(uVar7 >> 0x18));
      if (bVar2) {
        memset(&local_138,0xaa,0x38);
        QOscMessage::QOscMessage
                  ((QOscMessage *)in_RSI,(QByteArray *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
        bVar2 = QOscMessage::isValid(&local_138);
        if (bVar2) {
          *(undefined1 *)&(in_RDI->d).d = 1;
          *(byte *)((long)&(in_RDI->d).d + 1) = (byte)((uint)uVar9 >> 0x18) & 1;
          *(uint *)((long)&(in_RDI->d).d + 4) = uVar3;
          *(uint *)&(in_RDI->d).ptr = uVar4;
          QList<QOscMessage>::append
                    ((QList<QOscMessage> *)CONCAT44(line,uVar8),
                     (parameter_type)CONCAT44(uVar7,in_stack_fffffffffffffdf8));
          iVar10 = 0;
        }
        else {
          local_38 = 0xaaaaaaaaaaaaaaaa;
          local_30 = 0xaaaaaaaaaaaaaaaa;
          lcTuioBundle();
          anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(line,uVar8),
                     (QLoggingCategory *)CONCAT44(uVar7,in_stack_fffffffffffffdf8));
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1060f5);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)CONCAT44(uVar5,in_stack_fffffffffffffe10),(char *)in_RDI,
                       line,(char *)CONCAT44(uVar7,in_stack_fffffffffffffdf8),(char *)0x10610e);
            QMessageLogger::warning(local_158,"Invalid sub-message");
            local_30 = local_30 & 0xffffffffffffff00;
          }
          iVar10 = 1;
        }
        QOscMessage::~QOscMessage((QOscMessage *)CONCAT44(line,uVar8));
        if (iVar10 == 0) goto LAB_0010629c;
      }
      else {
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  ((QByteArrayView *)CONCAT44(uVar5,in_stack_fffffffffffffe10),in_RDI);
        bv.m_size._4_4_ = in_stack_fffffffffffffe24;
        bv.m_size._0_4_ = uVar3;
        bv.m_data = &in_RSI->m_isValid;
        bVar2 = QByteArray::startsWith(in_RDI,bv);
        if (bVar2) {
          memset(&local_1a8,0xaa,0x40);
          QOscBundle(in_RSI,(QByteArray *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
          bVar2 = isValid(&local_1a8);
          if (bVar2) {
            *(undefined1 *)&(in_RDI->d).d = 1;
            *(byte *)((long)&(in_RDI->d).d + 1) = (byte)((uint)uVar9 >> 0x18) & 1;
            *(uint *)((long)&(in_RDI->d).d + 4) = uVar3;
            *(uint *)&(in_RDI->d).ptr = uVar4;
            QList<QOscBundle>::append
                      ((QList<QOscBundle> *)CONCAT44(line,uVar8),
                       (parameter_type)CONCAT44(uVar7,in_stack_fffffffffffffdf8));
          }
          ~QOscBundle((QOscBundle *)CONCAT44(line,uVar8));
LAB_0010629c:
          iVar10 = 0;
        }
        else {
          local_48 = 0xaaaaaaaaaaaaaaaa;
          local_40 = 0xaaaaaaaaaaaaaaaa;
          lcTuioBundle();
          anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(line,uVar8),
                     (QLoggingCategory *)CONCAT44(uVar7,in_stack_fffffffffffffdf8));
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
            anon_unknown.dwarf_287d1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x10625d);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)CONCAT44(uVar5,in_stack_fffffffffffffe10),(char *)in_RDI,
                       line,(char *)CONCAT44(uVar7,in_stack_fffffffffffffdf8),(char *)0x106273);
            QMessageLogger::warning(local_1c8,"Malformed sub-data!");
            local_40 = local_40 & 0xffffffffffffff00;
          }
          iVar10 = 1;
        }
      }
      QByteArray::~QByteArray((QByteArray *)0x1062b1);
      QByteArray::~QByteArray((QByteArray *)0x1062be);
      if (iVar10 != 0) break;
      in_stack_fffffffffffffe24 = 0;
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x1062e2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QOscBundle::QOscBundle(const QByteArray &data)
    : m_isValid(false)
    , m_immediate(false)
    , m_timeEpoch(0)
    , m_timePico(0)
{
    // 8  16 24 32 40 48 56 64
    // #  b  u  n  d  l  e  \0
    // 23 62 75 6e 64 6c 65 00 // OSC string bundle identifier
    // 00 00 00 00 00 00 00 01 // osc time-tag, "immediately"
    // 00 00 00 30 // element length
    //      => message or bundle(s), preceded by length each time
    qCDebug(lcTuioBundle) << data.toHex();
    quint32 parsedBytes = 0;

    // "An OSC Bundle consists of the OSC-string "#bundle""
    QByteArray identifier;
    if (!qt_readOscString(data, identifier, parsedBytes) || identifier != "#bundle")
        return;

    // "followed by an OSC Time
    // Tag, followed by zero or more OSC Bundle Elements. The OSC-timetag is a
    // 64-bit fixed point time tag whose semantics are described below."
    if (parsedBytes > (quint32)data.size() || data.size() - parsedBytes < qsizetype(sizeof(quint64)))
        return;

    // "Time tags are represented by a 64 bit fixed point number. The first 32
    // bits specify the number of seconds since midnight on January 1,  1900,
    // and the last 32 bits specify fractional parts of a second to a precision
    // of about 200 picoseconds. This is the representation used by Internet NTP
    // timestamps."
    //
    // (editor's note: one may wonder how a 64bit big-endian number can also be
    // two 32bit numbers, without specifying in which order they occur or
    // anything, and one may indeed continue to wonder.)
    quint32 oscTimeEpoch = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);
    quint32 oscTimePico = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);

    bool isImmediate = false;

    if (oscTimeEpoch == 0 && oscTimePico == 1) {
        // "The time tag value consisting of 63 zero bits followed by a
        // one in the least significant bit is a special case meaning
        // "immediately.""
        isImmediate = true;
    }

    while (parsedBytes < (quint32)data.size()) {
        // "An OSC Bundle Element consists of its size and its contents. The size is an
        // int32 representing the number of 8-bit bytes in the contents, and will
        // always be a multiple of 4."
        //
        // in practice, a bundle can contain multiple bundles or messages,
        // though, and each is prefixed by a size.
        if (data.size() - parsedBytes < qsizetype(sizeof(quint32)))
            return;

        quint32 size = qFromBigEndian<quint32>((const uchar*)data.constData() + parsedBytes);
        parsedBytes += sizeof(quint32);

        if (data.size() - parsedBytes < size)
            return;

        if (size == 0) {
            // empty bundle; these are valid, but should they be allowed? the
            // spec is unclear on this...
            qCWarning(lcTuioBundle, "Empty bundle?");
            m_isValid = true;
            m_immediate = isImmediate;
            m_timeEpoch = oscTimeEpoch;
            m_timePico = oscTimePico;
            return;
        }

        // "The contents are either an OSC Message or an OSC Bundle.
        // Note this recursive definition: bundle may contain bundles."
        QByteArray subdata = data.mid(parsedBytes, size);
        parsedBytes += size;

        // "The contents of an OSC packet must be either an OSC Message or an OSC Bundle.
        // The first byte of the packet's contents unambiguously distinguishes between
        // these two alternatives."
        //
        // we're not dealing with a packet here, but the same trick works just
        // the same.
        QByteArray bundleIdentifier = QByteArray("#bundle\0",  8);
        if (subdata.startsWith('/')) {
            // starts with / => address pattern => start of a message
            QOscMessage subMessage(subdata);
            if (subMessage.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_messages.append(subMessage);
            } else {
                qCWarning(lcTuioBundle, "Invalid sub-message");
                return;
            }
        } else if (subdata.startsWith(bundleIdentifier)) {
            // bundle identifier start => bundle
            QOscBundle subBundle(subdata);
            if (subBundle.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_bundles.append(subBundle);
            }
        } else {
            qCWarning(lcTuioBundle, "Malformed sub-data!");
            return;
        }
    }
}